

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

int __thiscall
Imf_2_5::TypedAttribute<Imath_2_5::Matrix33<double>_>::copy
          (TypedAttribute<Imath_2_5::Matrix33<double>_> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Attribute *this_00;
  TypedAttribute<Imath_2_5::Matrix33<double>_> *pTVar1;
  long lVar2;
  Matrix33<double> *pMVar3;
  Attribute *pAVar4;
  byte bVar5;
  
  bVar5 = 0;
  this_00 = (Attribute *)operator_new(0x50);
  this_00->_vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  this_00[4]._vptr_Attribute = (_func_int **)0x0;
  this_00[5]._vptr_Attribute = (_func_int **)0x0;
  this_00[6]._vptr_Attribute = (_func_int **)0x0;
  this_00[7]._vptr_Attribute = (_func_int **)0x0;
  this_00[8]._vptr_Attribute = (_func_int **)0x0;
  this_00[9]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this_00);
  this_00->_vptr_Attribute = (_func_int **)&PTR__Attribute_0036ac88;
  this_00[1]._vptr_Attribute = (_func_int **)0x0;
  this_00[2]._vptr_Attribute = (_func_int **)0x0;
  this_00[5]._vptr_Attribute = (_func_int **)0x0;
  this_00[6]._vptr_Attribute = (_func_int **)0x0;
  this_00[3]._vptr_Attribute = (_func_int **)0x0;
  this_00[4]._vptr_Attribute = (_func_int **)0x0;
  this_00[7]._vptr_Attribute = (_func_int **)0x0;
  this_00[8]._vptr_Attribute = (_func_int **)0x0;
  this_00[1]._vptr_Attribute = (_func_int **)0x3ff0000000000000;
  this_00[5]._vptr_Attribute = (_func_int **)0x3ff0000000000000;
  this_00[9]._vptr_Attribute = (_func_int **)0x3ff0000000000000;
  pTVar1 = cast(&this->super_Attribute);
  pMVar3 = &pTVar1->_value;
  pAVar4 = this_00 + 1;
  for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
    pAVar4->_vptr_Attribute = (_func_int **)pMVar3->x[0][0];
    pMVar3 = (Matrix33<double> *)((long)pMVar3 + (ulong)bVar5 * -0x10 + 8);
    pAVar4 = pAVar4 + (ulong)bVar5 * -2 + 1;
  }
  return (int)this_00;
}

Assistant:

Attribute *
TypedAttribute<T>::copy () const
{
    Attribute * attribute = new TypedAttribute<T>();
    attribute->copyValueFrom (*this);
    return attribute;
}